

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::
ExceptionOr(ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>
            *this,OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *value)

{
  (this->super_ExceptionOrValue).exception.ptr.isSet = false;
  (this->value).ptr.isSet = true;
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::moveFrom
            (&(this->value).ptr.field_1.value,value);
  return;
}

Assistant:

ExceptionOr(T&& value): value(kj::mv(value)) {}